

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O2

void __thiscall
QUnicodeControlCharacterMenu::QUnicodeControlCharacterMenu
          (QUnicodeControlCharacterMenu *this,QObject *_editWidget,QWidget *parent)

{
  long lVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QMenu::QMenu((QMenu *)this,parent);
  *(undefined ***)this = &PTR_metaObject_007d9190;
  *(undefined ***)(this + 0x10) = &PTR__QUnicodeControlCharacterMenu_007d9348;
  *(QObject **)(this + 0x28) = _editWidget;
  tr((QString *)&local_50,"Insert Unicode control character",(char *)0x0,-1);
  QMenu::setTitle((QMenu *)this,(QString *)&local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  for (lVar1 = 0; lVar1 != 0xe0; lVar1 = lVar1 + 0x10) {
    tr((QString *)&local_50,*(char **)((long)&qt_controlCharacters[0].text + lVar1),(char *)0x0,-1);
    QWidget::addAction((QWidget *)this,(QString *)&local_50,(QObject *)this,"1menuActionTriggered()"
                       ,AutoConnection);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QUnicodeControlCharacterMenu::QUnicodeControlCharacterMenu(QObject *_editWidget, QWidget *parent)
    : QMenu(parent), editWidget(_editWidget)
{
    setTitle(tr("Insert Unicode control character"));
    for (int i = 0; i < NUM_CONTROL_CHARACTERS; ++i) {
        addAction(tr(qt_controlCharacters[i].text), this, SLOT(menuActionTriggered()));
    }
}